

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::trim::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,char c)

{
  undefined1 local_a;
  char c_local;
  anon_class_1_0_00000001 *this_local;
  
  local_a = true;
  if (((c != ' ') && (local_a = true, c != '\t')) && (local_a = true, c != '\n')) {
    local_a = c == '\r';
  }
  return local_a;
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }